

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

QList<std::pair<double,_double>_> * __thiscall
QGraphicsItemAnimation::rotationList
          (QList<std::pair<double,_double>_> *__return_storage_ptr__,QGraphicsItemAnimation *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<double,_double> *)0x0;
  uVar3 = *(ulong *)(*(long *)(this + 0x10) + 200);
  iVar1 = (int)uVar3;
  QList<std::pair<double,_double>_>::reserve(__return_storage_ptr__,(long)iVar1);
  uVar2 = 0;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    QList<std::pair<double,double>>::emplaceBack<double_const&,double_const&>
              ((QList<std::pair<double,double>> *)__return_storage_ptr__,
               (double *)(*(long *)(*(long *)(this + 0x10) + 0xc0) + uVar2),
               (double *)(*(long *)(*(long *)(this + 0x10) + 0xc0) + uVar2 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<qreal, qreal> > QGraphicsItemAnimation::rotationList() const
{
    QList<std::pair<qreal, qreal>> list;
    const int numRotations = d->rotation.size();
    list.reserve(numRotations);
    for (int i = 0; i < numRotations; ++i)
        list.emplace_back(d->rotation.at(i).step, d->rotation.at(i).value);

    return list;
}